

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

array<unsigned_char,_4UL> PacketProcessor::ENumber(uint number,size_t *size)

{
  uint uVar1;
  size_t sVar2;
  int i;
  array<unsigned_char,_4UL> bytes;
  
  bytes._M_elems[0] = 0xfe;
  bytes._M_elems[1] = 0xfe;
  bytes._M_elems[2] = 0xfe;
  bytes._M_elems[3] = 0xfe;
  uVar1 = number;
  if (0xf71ae4 < number) {
    bytes._M_elems[3] = (char)(number / 0xf71ae5) + '\x01';
    bytes._M_elems[0] = 0xfe;
    bytes._M_elems[1] = 0xfe;
    bytes._M_elems[2] = 0xfe;
    uVar1 = number % 0xf71ae5;
  }
  if (0xfa08 < number) {
    bytes._M_elems[2] = (char)((ulong)uVar1 * 0x1061b6d9b >> 0x30) + '\x01';
    uVar1 = uVar1 % 0xfa09;
  }
  if (0xfc < number) {
    bytes._M_elems =
         (_Type)((uint)CONCAT21(bytes._M_elems._2_2_,(char)(uVar1 / 0xfd) + '\x01') << 8);
    uVar1 = uVar1 % 0xfd;
  }
  bytes._M_elems[0] = (char)uVar1 + '\x01';
  uVar1 = 3;
  sVar2 = 4;
  do {
    if (bytes._M_elems[uVar1] != '\0') goto LAB_001819a4;
    sVar2 = sVar2 - 1;
    uVar1 = uVar1 - 1;
  } while (uVar1 != 0);
  sVar2 = 1;
LAB_001819a4:
  *size = sVar2;
  return (array<unsigned_char,_4UL>)bytes._M_elems;
}

Assistant:

std::array<unsigned char, 4> PacketProcessor::ENumber(unsigned int number, std::size_t &size)
{
	std::array<unsigned char, 4> bytes{{254, 254, 254, 254}};
	unsigned int onumber = number;

	if (onumber >= PacketProcessor::MAX3)
	{
		bytes[3] = number / PacketProcessor::MAX3 + 1;
		number = number % PacketProcessor::MAX3;
	}

	if (onumber >= PacketProcessor::MAX2)
	{
		bytes[2] = number / PacketProcessor::MAX2 + 1;
		number = number % PacketProcessor::MAX2;
	}

	if (onumber >= PacketProcessor::MAX1)
	{
		bytes[1] = number / PacketProcessor::MAX1 + 1;
		number = number % PacketProcessor::MAX1;
	}

	bytes[0] = number + 1;

	for (int i = 3; i >= 0; --i)
	{
		if (i == 0)
		{
			size = 1;
			break;
		}
		else if (bytes[i] > 0)
		{
			size = i + 1;
			break;
		}
	}

	return bytes;
}